

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall OpenMesh::PolyConnectivity::triangulate(PolyConnectivity *this,FaceHandle _fh)

{
  pointer *ppFVar1;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  BaseHandle BVar4;
  int iVar5;
  FaceHandle _fh_00;
  HalfedgeHandle _nheh;
  Face *pFVar6;
  Halfedge *pHVar7;
  undefined4 extraout_var;
  BaseHandle BVar8;
  pointer ppBVar9;
  BaseHandle _heh;
  Face local_44;
  HalfedgeHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  VertexHandle local_34;
  
  local_38 = _fh.super_BaseHandle.idx_;
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
  _heh.idx_ = (pFVar6->halfedge_handle_).super_BaseHandle.idx_;
  pHVar7 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,(HalfedgeHandle)((-(_heh.idx_ & 1U) | 1) + _heh.idx_)
                     );
  iVar5 = (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
  BVar8.idx_ = (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar8.idx_);
  pHVar7 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)
                      (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.
                      idx_);
  local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)iVar5;
  if ((pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ != iVar5) {
    do {
      local_3c.idx_ = BVar8.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar8.idx_);
      local_40.super_BaseHandle.idx_ =
           (BaseHandle)
           (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
      local_44.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
      __position._M_current =
           (this->super_ArrayKernel).faces_.
           super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ArrayKernel).faces_.
          super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
        _M_realloc_insert<OpenMesh::ArrayItems::Face>
                  (&(this->super_ArrayKernel).faces_,__position,&local_44);
      }
      else {
        ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
        ppFVar1 = &(this->super_ArrayKernel).faces_.
                   super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppFVar1 = *ppFVar1 + 1;
      }
      iVar5 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
      ppBVar2 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar9 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                     super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppBVar9 != ppBVar2;
          ppBVar9 = ppBVar9 + 1) {
        pBVar3 = *ppBVar9;
        if (pBVar3 != (BaseProperty *)0x0) {
          (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar5));
        }
      }
      _fh_00 = ArrayKernel::handle(&this->super_ArrayKernel,
                                   (this->super_ArrayKernel).faces_.
                                   super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1);
      pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.super_BaseHandle.idx_);
      BVar8.idx_ = local_3c.idx_;
      (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_3c.idx_);
      _nheh = ArrayKernel::new_edge
                        (&this->super_ArrayKernel,
                         (VertexHandle)
                         (pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_,
                         local_34);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)BVar8.idx_);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)BVar8.idx_,_nheh);
      ArrayKernel::set_next_halfedge_handle
                (&this->super_ArrayKernel,_nheh,(HalfedgeHandle)_heh.idx_);
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh_00.super_BaseHandle.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar8.idx_);
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh_00.super_BaseHandle.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh);
      BVar8 = local_40.super_BaseHandle.idx_;
      (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh_00.super_BaseHandle.idx_;
      _heh = (-((uint)_nheh.super_BaseHandle.idx_ & 1) | 1) + _nheh.super_BaseHandle.idx_;
      pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,local_40);
      pHVar7 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.
                          super_BaseHandle.idx_);
    } while ((BaseHandle)(pHVar7->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_
             != local_34.super_BaseHandle.idx_);
  }
  BVar4.idx_ = local_38.idx_;
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)local_38.idx_);
  (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)BVar8.idx_);
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar8.idx_);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,
             (HalfedgeHandle)
             (pHVar7->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_,
             (HalfedgeHandle)_heh.idx_);
  pHVar7 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
  (pHVar7->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = BVar4.idx_;
  return;
}

Assistant:

void PolyConnectivity::triangulate(FaceHandle _fh)
{
  /*
    Split an arbitrary face into triangles by connecting
    each vertex of fh after its second to vh.

    - fh will remain valid (it will become one of the
      triangles)
    - the halfedge handles of the new triangles will
      point to the old halfedges
  */

  HalfedgeHandle base_heh(halfedge_handle(_fh));
  VertexHandle start_vh = from_vertex_handle(base_heh);
  HalfedgeHandle next_heh(next_halfedge_handle(base_heh));

  while (to_vertex_handle(next_halfedge_handle(next_heh)) != start_vh)
  {
    HalfedgeHandle next_next_heh(next_halfedge_handle(next_heh));

    FaceHandle new_fh = new_face();
    set_halfedge_handle(new_fh, base_heh);

    HalfedgeHandle new_heh = new_edge(to_vertex_handle(next_heh), start_vh);

    set_next_halfedge_handle(base_heh, next_heh);
    set_next_halfedge_handle(next_heh, new_heh);
    set_next_halfedge_handle(new_heh, base_heh);

    set_face_handle(base_heh, new_fh);
    set_face_handle(next_heh, new_fh);
    set_face_handle(new_heh,  new_fh);

    base_heh = opposite_halfedge_handle(new_heh);
    next_heh = next_next_heh;
  }
  set_halfedge_handle(_fh, base_heh);  //the last face takes the handle _fh

  set_next_halfedge_handle(base_heh, next_heh);
  set_next_halfedge_handle(next_halfedge_handle(next_heh), base_heh);

  set_face_handle(base_heh, _fh);
}